

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O1

Point2f __thiscall pbrt::HaltonPixelIndexer::SampleFirst2D(HaltonPixelIndexer *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 in_XMM3_Da;
  undefined1 in_register_000012c4 [12];
  
  uVar1 = this->sampleIndex >>
          ((ulong)(byte)(this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x & 0x3f);
  auVar5 = ZEXT816(0) << 0x40;
  auVar6 = ZEXT816(0) << 0x40;
  if (uVar1 != 0) {
    fVar4 = 1.0;
    lVar2 = 0;
    do {
      lVar2 = (lVar2 - uVar1 / 2) * 2 + uVar1;
      fVar4 = fVar4 * 0.5;
      bVar3 = 1 < uVar1;
      uVar1 = uVar1 / 2;
    } while (bVar3);
    auVar6._4_12_ = in_register_000012c4;
    auVar6._0_4_ = in_XMM3_Da;
    auVar6 = vcvtusi2ss_avx512f(auVar6,lVar2);
    auVar6 = ZEXT416((uint)(fVar4 * auVar6._0_4_));
  }
  uVar1 = this->sampleIndex / (long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y;
  if (uVar1 != 0) {
    fVar4 = 1.0;
    lVar2 = 0;
    do {
      lVar2 = (lVar2 - uVar1 / 3) * 3 + uVar1;
      fVar4 = fVar4 * 0.33333334;
      bVar3 = 2 < uVar1;
      uVar1 = uVar1 / 3;
    } while (bVar3);
    auVar5._4_12_ = in_register_000012c4;
    auVar5._0_4_ = in_XMM3_Da;
    auVar5 = vcvtusi2ss_avx512f(auVar5,lVar2);
    auVar5 = ZEXT416((uint)(fVar4 * auVar5._0_4_));
  }
  auVar5 = vinsertps_avx(auVar6,auVar5,0x10);
  auVar7._8_4_ = 0x3f7fffff;
  auVar7._0_8_ = 0x3f7fffff3f7fffff;
  auVar7._12_4_ = 0x3f7fffff;
  auVar5 = vminps_avx(auVar7,auVar5);
  return (Point2f)auVar5._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f SampleFirst2D() const {
        return {RadicalInverse(0, sampleIndex >> baseExponents[0]),
                RadicalInverse(1, sampleIndex / baseScales[1])};
    }